

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_alloc.c
# Opt level: O1

size_t release_unused_segments(mstate m)

{
  int iVar1;
  char *__addr;
  malloc_segment *pmVar2;
  size_t __len;
  malloc_tree_chunk *pmVar3;
  bindex_t bVar4;
  uint uVar5;
  malloc_tree_chunk *pmVar6;
  int iVar7;
  malloc_tree_chunk **ppmVar8;
  int *piVar9;
  malloc_tree_chunk *pmVar10;
  tbinptr pmVar11;
  size_t sVar12;
  ulong uVar13;
  long lVar14;
  tbinptr pmVar15;
  uint uVar16;
  byte bVar17;
  malloc_segment *pmVar18;
  malloc_segment *pmVar19;
  malloc_segment *pmVar20;
  ulong uVar21;
  ulong uVar22;
  size_t local_68;
  
  pmVar18 = (m->seg).next;
  if (pmVar18 == (malloc_segment *)0x0) {
    uVar21 = 0;
    local_68 = 0;
LAB_00142fd5:
    sVar12 = 0xff;
    if (0xff < uVar21) {
      sVar12 = uVar21;
    }
    m->release_checks = sVar12;
    return local_68;
  }
  local_68 = 0;
  uVar21 = 0;
  pmVar19 = &m->seg;
LAB_00142d27:
  __addr = pmVar18->base;
  pmVar2 = pmVar18->next;
  uVar22 = (ulong)(-(int)__addr - 0x10U & 7);
  uVar13 = *(ulong *)(__addr + uVar22 + 8);
  pmVar20 = pmVar18;
  if ((uVar13 & 2) == 0) {
    __len = pmVar18->size;
    pmVar15 = (tbinptr)(__addr + uVar22);
    uVar22 = uVar13 & 0xfffffffffffffffc;
    if ((char *)((long)pmVar15->child + (uVar22 - 0x20)) < __addr + (__len - 0x40))
    goto LAB_00142fb4;
    if (pmVar15 != (tbinptr)m->dv) {
      pmVar11 = pmVar15->bk;
      pmVar10 = pmVar15->child[2];
      if (pmVar11 == pmVar15) {
        pmVar11 = pmVar15->child[1];
        if (pmVar11 != (tbinptr)0x0) {
          ppmVar8 = pmVar15->child + 1;
LAB_00142de2:
          do {
            if (pmVar11->child[1] == (malloc_tree_chunk *)0x0) {
              if (pmVar11->child[0] == (malloc_tree_chunk *)0x0) goto code_r0x00142df6;
              ppmVar8 = pmVar11->child;
            }
            else {
              ppmVar8 = pmVar11->child + 1;
            }
            pmVar11 = *ppmVar8;
          } while( true );
        }
        pmVar11 = pmVar15->child[0];
        if (pmVar11 != (tbinptr)0x0) {
          ppmVar8 = pmVar15->child;
          goto LAB_00142de2;
        }
        pmVar11 = (tbinptr)0x0;
      }
      else {
        pmVar3 = pmVar15->fd;
        pmVar3->bk = pmVar11;
        pmVar11->fd = pmVar3;
      }
      goto LAB_00142dfd;
    }
    m->dv = (mchunkptr)0x0;
    m->dvsize = 0;
    goto LAB_00142e64;
  }
  goto LAB_00142fb4;
code_r0x00142df6:
  *ppmVar8 = (malloc_tree_chunk *)0x0;
LAB_00142dfd:
  if (pmVar10 == (malloc_tree_chunk *)0x0) goto LAB_00142e64;
  bVar4 = (bindex_t)pmVar15->child[3];
  if (pmVar15 == m->treebins[bVar4]) {
    m->treebins[bVar4] = pmVar11;
    if (pmVar11 == (tbinptr)0x0) {
      bVar17 = (byte)bVar4 & 0x1f;
      m->treemap = m->treemap & (-2 << bVar17 | 0xfffffffeU >> 0x20 - bVar17);
      goto LAB_00142e39;
    }
  }
  else {
    if (pmVar10->child[0] == pmVar15) {
      pmVar10->child[0] = pmVar11;
    }
    else {
      pmVar10->child[1] = pmVar11;
    }
LAB_00142e39:
    if (pmVar11 == (tbinptr)0x0) goto LAB_00142e64;
  }
  pmVar11->child[2] = pmVar10;
  pmVar10 = pmVar15->child[0];
  if (pmVar10 != (malloc_tree_chunk *)0x0) {
    pmVar11->child[0] = pmVar10;
    pmVar10->parent = pmVar11;
  }
  pmVar10 = pmVar15->child[1];
  if (pmVar10 != (malloc_tree_chunk *)0x0) {
    pmVar11->child[1] = pmVar10;
    pmVar10->parent = pmVar11;
  }
LAB_00142e64:
  piVar9 = __errno_location();
  iVar1 = *piVar9;
  iVar7 = munmap(__addr,__len);
  *piVar9 = iVar1;
  if (iVar7 == 0) {
    local_68 = local_68 + __len;
    pmVar19->next = pmVar2;
    pmVar20 = pmVar19;
  }
  else {
    uVar16 = (uint)(uVar13 >> 8);
    if (uVar16 == 0) {
      uVar13 = 0;
    }
    else {
      uVar13 = 0x1f;
      if (uVar16 < 0x10000) {
        uVar5 = 0x1f;
        if (uVar16 != 0) {
          for (; uVar16 >> uVar5 == 0; uVar5 = uVar5 - 1) {
          }
        }
        uVar13 = (ulong)((uVar22 >> ((ulong)(byte)(0x26 - (char)(uVar5 ^ 0x1f)) & 0x3f) & 1) != 0) |
                 (ulong)((uVar5 ^ 0x1f) * 2 ^ 0x3e);
      }
    }
    pmVar10 = (malloc_tree_chunk *)(m->treebins + uVar13);
    pmVar15->child[3] = (malloc_tree_chunk *)uVar13;
    pmVar15->child[0] = (malloc_tree_chunk *)0x0;
    pmVar15->child[1] = (malloc_tree_chunk *)0x0;
    if ((m->treemap >> ((uint)uVar13 & 0x1f) & 1) == 0) {
      m->treemap = m->treemap | 1 << ((byte)uVar13 & 0x1f);
      pmVar10->prev_foot = (size_t)pmVar15;
      pmVar15->child[2] = pmVar10;
      pmVar15->bk = pmVar15;
      pmVar15->fd = pmVar15;
    }
    else {
      pmVar10 = (malloc_tree_chunk *)pmVar10->prev_foot;
      bVar17 = 0x39 - (char)(uVar13 >> 1);
      if (uVar13 == 0x1f) {
        bVar17 = 0;
      }
      lVar14 = uVar22 << (bVar17 & 0x3f);
      do {
        if ((pmVar10->head & 0xfffffffffffffffc) == uVar22) {
          pmVar3 = pmVar10->fd;
          pmVar3->bk = pmVar15;
          pmVar10->fd = pmVar15;
          pmVar15->fd = pmVar3;
          pmVar15->bk = pmVar10;
          pmVar15->child[2] = (malloc_tree_chunk *)0x0;
          break;
        }
        pmVar3 = *(malloc_tree_chunk **)((long)pmVar10 + (lVar14 >> 0x3f) * -8 + 0x20);
        pmVar6 = pmVar3;
        if (pmVar3 == (malloc_tree_chunk *)0x0) {
          *(tbinptr *)((long)pmVar10 + (lVar14 >> 0x3f) * -8 + 0x20) = pmVar15;
          pmVar15->child[2] = pmVar10;
          pmVar15->bk = pmVar15;
          pmVar15->fd = pmVar15;
          pmVar6 = pmVar10;
        }
        pmVar10 = pmVar6;
        lVar14 = lVar14 * 2;
      } while (pmVar3 != (malloc_tree_chunk *)0x0);
    }
  }
LAB_00142fb4:
  uVar21 = uVar21 + 1;
  pmVar18 = pmVar2;
  pmVar19 = pmVar20;
  if (pmVar2 == (malloc_segment *)0x0) goto LAB_00142fd5;
  goto LAB_00142d27;
}

Assistant:

static size_t release_unused_segments(mstate m)
{
  size_t released = 0;
  size_t nsegs = 0;
  msegmentptr pred = &m->seg;
  msegmentptr sp = pred->next;
  while (sp != 0) {
    char *base = sp->base;
    size_t size = sp->size;
    msegmentptr next = sp->next;
    nsegs++;
    {
      mchunkptr p = align_as_chunk(base);
      size_t psize = chunksize(p);
      /* Can unmap if first chunk holds entire segment and not pinned */
      if (!cinuse(p) && (char *)p + psize >= base + size - TOP_FOOT_SIZE) {
	tchunkptr tp = (tchunkptr)p;
	if (p == m->dv) {
	  m->dv = 0;
	  m->dvsize = 0;
	} else {
	  unlink_large_chunk(m, tp);
	}
	if (CALL_MUNMAP(base, size) == 0) {
	  released += size;
	  /* unlink obsoleted record */
	  sp = pred;
	  sp->next = next;
	} else { /* back out if cannot unmap */
	  insert_large_chunk(m, tp, psize);
	}
      }
    }
    pred = sp;
    sp = next;
  }
  /* Reset check counter */
  m->release_checks = nsegs > MAX_RELEASE_CHECK_RATE ?
		      nsegs : MAX_RELEASE_CHECK_RATE;
  return released;
}